

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  ushort uVar1;
  int iVar2;
  uint8_t uVar3;
  _Bool _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint32_t base;
  ulong uVar9;
  run_container_t *cont;
  bool bVar10;
  bool local_51;
  
  iVar2 = (r->high_low_container).size;
  local_51 = iVar2 < 1;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      cont = (run_container_t *)(r->high_low_container).containers[lVar8];
      uVar3 = (r->high_low_container).typecodes[lVar8];
      uVar1 = (r->high_low_container).keys[lVar8];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&cont->runs;
        if (uVar3 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        cont = *(run_container_t **)cont;
      }
      base = (uint)uVar1 << 0x10;
      if (uVar3 == '\x03') {
        bVar10 = run_container_iterate64(cont,base,iterator,high_bits,ptr);
      }
      else if (uVar3 == '\x02') {
        bVar10 = cont->n_runs < 1;
        if (0 < cont->n_runs) {
          _Var4 = (*iterator)(CONCAT22(uVar1,cont->runs->value) | high_bits,ptr);
          if (!_Var4) {
            return local_51;
          }
          lVar5 = 1;
          while (bVar10 = cont->n_runs <= lVar5, lVar5 < cont->n_runs) {
            _Var4 = (*iterator)(CONCAT22(uVar1,(&cont->runs->value)[lVar5]) | high_bits,ptr);
            lVar5 = lVar5 + 1;
            if (!_Var4) {
              return local_51;
            }
          }
        }
      }
      else {
        if (uVar3 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1803,
                        "_Bool container_iterate64(const container_t *, uint8_t, uint32_t, roaring_iterator64, uint64_t, void *)"
                       );
        }
        uVar9 = 0;
        bVar10 = false;
        do {
          uVar7 = *(ulong *)(cont->runs + uVar9 * 2);
          do {
            uVar6 = uVar7;
            if (uVar6 == 0) {
              base = base + 0x40;
              break;
            }
            lVar5 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            _Var4 = (*iterator)((int)lVar5 + base | high_bits,ptr);
            if (_Var4) {
              uVar7 = uVar6 - 1;
            }
            else {
              uVar7 = 0xffffffffffffffff;
            }
            uVar7 = uVar7 & uVar6;
          } while (_Var4);
          if (uVar6 != 0) break;
          bVar10 = 0x3fe < uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x400);
      }
      if (bVar10 == false) {
        return local_51;
      }
      lVar8 = lVar8 + 1;
      lVar5 = (long)(r->high_low_container).size;
      local_51 = lVar5 <= lVar8;
    } while (lVar8 < lVar5);
  }
  return local_51;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(
                ra->containers[i], ra->typecodes[i],
                ((uint32_t)ra->keys[i]) << 16, iterator,
                high_bits, ptr)) {
            return false;
        }
    return true;
}